

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O3

bool __thiscall pg::DTLSolver::search(DTLSolver *this,int player)

{
  bitset *R;
  ulong *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint64_t *puVar5;
  size_t sVar6;
  pointer piVar7;
  pointer piVar8;
  uint *puVar9;
  Oink *this_00;
  int *piVar10;
  byte bVar11;
  int iVar12;
  ulong uVar13;
  void *pvVar14;
  uint64_t *puVar15;
  ostream *poVar16;
  Game *pGVar17;
  int *val;
  int *val_00;
  long lVar18;
  char *pcVar19;
  long lVar20;
  bool bVar21;
  int iVar22;
  int *piVar23;
  ulong uVar24;
  int aiStack_d0 [8];
  undefined1 local_b0 [8];
  bitset V_1;
  bitset V;
  
  iVar2 = this->tangles;
  pGVar17 = (this->super_Solver).game;
  iVar3 = this->dominions;
  puVar15 = (uint64_t *)pGVar17->n_vertices;
  uVar13 = (long)puVar15 * 4 + 0xfU & 0xfffffffffffffff0;
  val = (int *)((long)aiStack_d0 + (0x18 - uVar13));
  val_00 = (int *)((long)val - uVar13);
  if ((this->super_Solver).trace != 0) {
    V._size = (long)puVar15 + 0x3fU >> 6;
    uVar13 = V._size << 3;
    V._bits = puVar15;
    V._bitssize = uVar13;
    val_00[-2] = 0x17eb1c;
    val_00[-1] = 0;
    pvVar14 = operator_new__(uVar13);
    V_1._allocsize = (size_t)pvVar14;
    if (0x3f < (long)puVar15 + 0x3fU) {
      val_00[-2] = 0x17eb43;
      val_00[-1] = 0;
      memset(pvVar14,0,uVar13);
      if (0 < (long)puVar15) {
        uVar13 = 0;
        puVar5 = (this->G)._bits;
        do {
          if (((puVar5[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0) &&
             ((pGVar17->_priority[uVar13] & 1U) == player)) {
            puVar1 = (ulong *)((long)pvVar14 + (uVar13 >> 6) * 8);
            *puVar1 = *puVar1 | 1L << (uVar13 & 0x3f);
          }
          uVar13 = uVar13 + 1;
        } while ((long)uVar13 < (long)puVar15);
      }
    }
    val_00[-2] = 0x17ebb5;
    val_00[-1] = 0;
    computeDistanceValues(this,(bitset *)&V_1._allocsize,&this->G,&this->G,val,player);
    val_00[-2] = 0x17ebbd;
    val_00[-1] = 0;
    operator_delete__(pvVar14);
  }
  uVar24 = (this->G)._bitssize;
  V._bits = (uint64_t *)(this->G)._size;
  V._size = (this->G)._bitssize;
  R = &this->G;
  uVar13 = uVar24 * 8;
  V._bitssize = uVar13;
  val_00[-2] = 0x17ebfa;
  val_00[-1] = 0;
  pvVar14 = operator_new__(-(ulong)(uVar24 >> 0x3d != 0) | uVar13);
  V_1._allocsize = (size_t)pvVar14;
  if (uVar24 != 0) {
    puVar15 = R->_bits;
    val_00[-2] = 0x17ec15;
    val_00[-1] = 0;
    memmove(pvVar14,puVar15,uVar13);
  }
  val_00[-2] = 0x17ec2d;
  val_00[-1] = 0;
  search_rec(this,(bitset *)&V_1._allocsize,player,0);
  sVar6 = (this->W)._bitssize;
  if (sVar6 != 0) {
    puVar15 = (this->W)._bits;
    val_00[-2] = 0x17ec4b;
    val_00[-1] = 0;
    memset(puVar15,0,sVar6 << 3);
  }
  piVar7 = (this->dom_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar8 = (this->dom_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar7 != piVar8) {
    puVar9 = (this->Q).queue;
    piVar23 = this->str;
    lVar20 = 1;
    do {
      uVar4 = piVar7[lVar20 + -1];
      piVar23[(int)uVar4] = piVar7[lVar20];
      iVar12 = (this->Q).pointer;
      (this->Q).pointer = iVar12 + 1;
      puVar9[iVar12] = uVar4;
      iVar12 = (int)lVar20;
      lVar20 = lVar20 + 2;
    } while ((ulong)(iVar12 + 1) < (ulong)((long)piVar8 - (long)piVar7 >> 2));
    (this->dom_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = piVar7;
    iVar12 = (this->Q).pointer;
    if (iVar12 != 0) {
      do {
        this_00 = (this->super_Solver).oink;
        (this->Q).pointer = iVar12 + -1;
        uVar4 = (this->Q).queue[(long)iVar12 + -1];
        uVar13 = (ulong)(int)uVar4;
        iVar12 = this->str[uVar13];
        val_00[-2] = 0x17ed02;
        val_00[-1] = 0;
        Oink::solve(this_00,uVar4,player,iVar12);
        bVar11 = (byte)uVar4 & 0x3f;
        puVar1 = (this->G)._bits + (uVar13 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
        val_00[-4] = -1;
        val_00[-3] = -1;
        val_00[-6] = 0x17ed3e;
        val_00[-5] = 0;
        attractVertices(this,player,uVar4,R,&this->S,R,val_00[-4]);
        piVar10 = this->tin[uVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (piVar23 = this->tin[uVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start; piVar23 != piVar10; piVar23 = piVar23 + 1)
        {
          iVar12 = *piVar23;
          val_00[-4] = -1;
          val_00[-3] = -1;
          val_00[-6] = 0x17ed77;
          val_00[-5] = 0;
          attractTangle(this,iVar12,player,R,&this->S,R,val_00[-4]);
        }
        iVar12 = (this->Q).pointer;
      } while (iVar12 != 0);
    }
    sVar6 = (this->S)._bitssize;
    if (sVar6 != 0) {
      puVar15 = (this->S)._bits;
      val_00[-2] = 0x17edb5;
      val_00[-1] = 0;
      memset(puVar15,0,sVar6 << 3);
    }
  }
  iVar12 = this->tangles;
  iVar22 = this->dominions;
  if (iVar22 != iVar3 || (iVar12 == iVar2 || (this->super_Solver).trace < 3)) goto LAB_0017f011;
  pGVar17 = (this->super_Solver).game;
  V_1._bits = (uint64_t *)pGVar17->n_vertices;
  uVar13 = (long)V_1._bits + 0x3f;
  V_1._size = uVar13 >> 6;
  uVar24 = V_1._size << 3;
  V_1._bitssize = uVar24;
  val_00[-2] = 0x17ee14;
  val_00[-1] = 0;
  puVar15 = (uint64_t *)operator_new__(uVar24);
  local_b0 = (undefined1  [8])puVar15;
  if (0x3f < uVar13) {
    val_00[-2] = 0x17ee31;
    val_00[-1] = 0;
    memset(puVar15,0,uVar24);
  }
  lVar20 = pGVar17->n_vertices;
  if (0 < lVar20) {
    puVar5 = R->_bits;
    uVar13 = 0;
    do {
      if (((puVar5[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0) &&
         ((pGVar17->_priority[uVar13] & 1U) == player)) {
        puVar15[uVar13 >> 6] = puVar15[uVar13 >> 6] | 1L << (uVar13 & 0x3f);
        lVar20 = pGVar17->n_vertices;
      }
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 < lVar20);
  }
  val_00[-2] = 0x17ee9f;
  val_00[-1] = 0;
  computeDistanceValues(this,(bitset *)local_b0,R,R,val_00,player);
  pGVar17 = (this->super_Solver).game;
  if (pGVar17->n_vertices < 1) {
LAB_0017efeb:
    poVar16 = (this->super_Solver).logger;
    val_00[-2] = 0x17f000;
    val_00[-1] = 0;
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"nothing changed!\n",0x11);
  }
  else {
    lVar20 = 0;
    bVar21 = false;
    do {
      iVar12 = val[lVar20];
      iVar22 = val_00[lVar20];
      if (iVar12 != iVar22) {
        poVar16 = (this->super_Solver).logger;
        V._allocsize = (size_t)pGVar17;
        val_00[-2] = 0x17eee9;
        val_00[-1] = 0;
        poVar16 = operator<<(poVar16,(_label_vertex *)&V._allocsize);
        val_00[-2] = 0x17ef00;
        val_00[-1] = 0;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,": ",2);
        val_00[-2] = 0x17ef0b;
        val_00[-1] = 0;
        poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar12);
        val_00[-2] = 0x17ef1f;
        val_00[-1] = 0;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16," => ",4);
        lVar18 = 4;
        poVar16 = (this->super_Solver).logger;
        if (iVar22 == 0x7fffffff) {
          pcVar19 = "MAX\n";
        }
        else {
          val_00[-2] = 0x17ef49;
          val_00[-1] = 0;
          poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar22);
          lVar18 = 1;
          pcVar19 = "\n";
        }
        bVar21 = true;
        val_00[-2] = 0x17ef60;
        val_00[-1] = 0;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar19,lVar18);
      }
      pGVar17 = (this->super_Solver).game;
      lVar20 = lVar20 + 1;
    } while (lVar20 < pGVar17->n_vertices);
    if (!bVar21) {
      if (0 < pGVar17->n_vertices) {
        lVar20 = 0;
        do {
          poVar16 = (this->super_Solver).logger;
          V._allocsize = (size_t)pGVar17;
          val_00[-2] = 0x17efa8;
          val_00[-1] = 0;
          poVar16 = operator<<(poVar16,(_label_vertex *)&V._allocsize);
          val_00[-2] = 0x17efbb;
          val_00[-1] = 0;
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,": ",2);
          iVar12 = val[lVar20];
          val_00[-2] = 0x17efcb;
          val_00[-1] = 0;
          poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar12);
          val_00[-2] = 0x17efdb;
          val_00[-1] = 0;
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
          lVar20 = lVar20 + 1;
          pGVar17 = (this->super_Solver).game;
        } while (lVar20 < pGVar17->n_vertices);
      }
      goto LAB_0017efeb;
    }
  }
  val_00[-2] = 0x17f009;
  val_00[-1] = 0;
  operator_delete__(puVar15);
  iVar22 = this->dominions;
  iVar12 = this->tangles;
LAB_0017f011:
  sVar6 = V_1._allocsize;
  if (V_1._allocsize != 0) {
    val_00[-2] = 0x17f022;
    val_00[-1] = 0;
    operator_delete__((void *)sVar6);
  }
  return iVar22 != iVar3 || iVar12 != iVar2;
}

Assistant:

bool
DTLSolver::search(const int player)
{
    const int T = tangles;
    const int D = dominions;

#ifndef NDEBUG
    int val1[nodecount()], val2[nodecount()];
    if (trace) {
        bitset V(nodecount()); // the current V
        for (int v=0; v<nodecount(); v++) {
            if (G[v] and (priority(v)&1) == player) V[v] = true;
        }
        computeDistanceValues(V, G, G, val1, player);
    }
#endif

    bitset CurG(G);
    search_rec(CurG, player, 0);
    W.reset();

    /**
     * Extend any dominions that were found.
     * (Any solved vertices are now in <SQ>.)
     */

    if (!dom_vector.empty()) {
        for (unsigned i = 0; i<dom_vector.size(); i+=2) {
            int v = dom_vector[i];
            int s = dom_vector[i+1];
            str[v] = s;
            Q.push(v);
        }
        dom_vector.clear();

        while (Q.nonempty()) {
            const int v = Q.pop();
            Solver::solve(v, player, str[v]);
            G[v] = false; // remove from Game
            attractVertices(player, v, G, S, G, -1);
            attractTangles(player, v, G, S, G, -1);
        }
        S.reset();
    }

#ifndef NDEBUG
    if (trace >= 3) {
        if (tangles != T and dominions == D) {
            bitset V(nodecount()); // the current V
            for (int v=0; v<nodecount(); v++) {
                if (G[v] and (priority(v)&1) == player) V[v] = true;
            }
            computeDistanceValues(V, G, G, val2, player);
            bool a_change = false;
            for (int v=0; v<nodecount(); v++) {
                if (val1[v] != val2[v]) {
                    logger << label_vertex(v) << ": " << val1[v] << " => ";
                    if (val2[v] == INT_MAX)  logger << "MAX\n";
                    else logger << val2[v] << "\n";
                    a_change = true;
                }
            }
            if (!a_change) {
                for (int v=0; v<nodecount(); v++) logger << label_vertex(v) << ": " << val1[v] << "\n";
                logger << "nothing changed!\n";
                // throw "nothing changed!";
            }
        }
    }
#endif

    return tangles != T or dominions != D;
}